

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O2

void __thiscall ELFIO::elfio::create_mandatory_sections(elfio *this)

{
  section *psVar1;
  allocator<char> local_39;
  string local_38;
  
  psVar1 = create_section(this);
  local_38._M_dataplus._M_p = local_38._M_dataplus._M_p & 0xffffffffffff0000;
  (*psVar1->_vptr_section[0x23])(psVar1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
  (*psVar1->_vptr_section[4])(psVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_38._M_dataplus._M_p = local_38._M_dataplus._M_p & 0xffffffff00000000;
  (*psVar1->_vptr_section[0x16])(psVar1,&local_38);
  set_section_name_str_index(this,1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,".shstrtab",&local_39);
  psVar1 = Sections::add(&this->sections,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  (*psVar1->_vptr_section[6])(psVar1,&SHT_STRTAB);
  local_38._M_dataplus._M_p = (pointer)0x1;
  (*psVar1->_vptr_section[0xe])(psVar1,&local_38);
  return;
}

Assistant:

void create_mandatory_sections()
    {
        // Create null section without calling to 'add_section' as no string
        // section containing section names exists yet
        section* sec0 = create_section();
        sec0->set_index( 0 );
        sec0->set_name( "" );
        sec0->set_name_string_offset( 0 );

        set_section_name_str_index( 1 );
        section* shstrtab = sections.add( ".shstrtab" );
        shstrtab->set_type( SHT_STRTAB );
        shstrtab->set_addr_align( 1 );
    }